

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketMonitor_UNIX.cpp
# Opt level: O3

void __thiscall
FIX::SocketMonitor::processPollList
          (SocketMonitor *this,Strategy *strategy,pollfd *pfds,uint pfds_size)

{
  ushort uVar1;
  ulong uVar2;
  
  if (pfds_size != 0) {
    uVar2 = 0;
    do {
      uVar1 = pfds[uVar2].revents;
      if ((uVar1 & 3) != 0) {
        processRead(this,strategy,pfds[uVar2].fd);
        uVar1 = pfds[uVar2].revents;
      }
      if ((uVar1 & 4) != 0) {
        processWrite(this,strategy,pfds[uVar2].fd);
        uVar1 = pfds[uVar2].revents;
      }
      if ((uVar1 & 8) != 0) {
        (*strategy->_vptr_Strategy[5])(strategy,this,(ulong)(uint)pfds[uVar2].fd);
      }
      uVar2 = uVar2 + 1;
    } while (pfds_size != uVar2);
  }
  return;
}

Assistant:

void SocketMonitor::processPollList(Strategy &strategy, struct pollfd *pfds, unsigned pfds_size) {
  for (unsigned i = 0; i < pfds_size; ++i) {
    if ((pfds[i].revents & POLLIN) || (pfds[i].revents & POLLPRI)) {
      processRead(strategy, pfds[i].fd);
    }

    if ((pfds[i].revents & POLLOUT)) {
      processWrite(strategy, pfds[i].fd);
    }
    if ((pfds[i].revents & POLLERR)) {
      processError(strategy, pfds[i].fd);
    }
  }
}